

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestCase::initPrograms
          (GridRenderTestCase *this,SourceCollections *programCollection)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ostream *poVar5;
  ProgramSources *pPVar6;
  int iVar7;
  allocator<char> local_211;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [40];
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar5 = std::operator<<((ostream *)&src,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"vert",&local_211);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_1d0,&local_210);
  glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar5 = std::operator<<((ostream *)&src,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) flat in highp   vec4 v_color;\n");
  poVar5 = std::operator<<(poVar5,"layout(location = 0) out     mediump vec4 fragColor;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    fragColor = v_color;\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"frag",&local_211);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_1d0,&local_210);
  glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar5 = std::operator<<((ostream *)&src,pcVar4);
  poVar5 = std::operator<<(poVar5,
                           "\n#extension GL_EXT_tessellation_shader : require\nlayout(vertices = 1) out;\n\nvoid main (void)\n{\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelInner[0] = float("
                          );
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
  poVar5 = std::operator<<(poVar5,");\n    gl_TessLevelInner[1] = float(");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
  poVar5 = std::operator<<(poVar5,");\n    gl_TessLevelOuter[0] = float(");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
  poVar5 = std::operator<<(poVar5,");\n    gl_TessLevelOuter[1] = float(");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
  poVar5 = std::operator<<(poVar5,");\n    gl_TessLevelOuter[2] = float(");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
  poVar5 = std::operator<<(poVar5,");\n    gl_TessLevelOuter[3] = float(");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
  std::operator<<(poVar5,");\n}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"tesc",&local_211);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_1d0,&local_210);
  glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar5 = std::operator<<((ostream *)&src,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"#extension GL_EXT_tessellation_shader : require\n");
  poVar5 = std::operator<<(poVar5,"layout(quads) in;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,
                           "layout(location = 0) out mediump ivec2 v_tessellationGridPosition;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,
                           "// note: No need to use precise gl_Position since position does not depend on order\n"
                          );
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  std::operator<<(poVar5,"{\n");
  if ((this->m_flags & 0x58) == 0) {
    poVar5 = std::operator<<((ostream *)&src,"    // Fill the whole viewport\n");
    pcVar4 = 
    "    gl_Position = vec4(gl_TessCoord.x * 2.0 - 1.0, gl_TessCoord.y * 2.0 - 1.0, 0.0, 1.0);\n";
  }
  else {
    poVar5 = std::operator<<((ostream *)&src,
                             "    // Cover only a small area in a corner. The area will be expanded in geometry shader to cover whole viewport\n"
                            );
    pcVar4 = 
    "    gl_Position = vec4(gl_TessCoord.x * 0.3 - 1.0, gl_TessCoord.y * 0.3 - 1.0, 0.0, 1.0);\n";
  }
  std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<((ostream *)&src,"    // Calculate position in tessellation grid\n");
  poVar5 = std::operator<<(poVar5,
                           "    v_tessellationGridPosition = ivec2(round(gl_TessCoord.xy * float(");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
  poVar5 = std::operator<<(poVar5,")));\n");
  std::operator<<(poVar5,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"tese",&local_211);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_1d0,&local_210);
  glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  iVar1 = this->m_numGeometryInvocations;
  iVar2 = this->m_numGeometryPrimitivesPerInvocation;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  poVar5 = std::operator<<((ostream *)&src,pcVar4);
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"#extension GL_EXT_geometry_shader : require\n");
  poVar5 = std::operator<<(poVar5,"layout(triangles, invocations = ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
  poVar5 = std::operator<<(poVar5,") in;\n");
  poVar5 = std::operator<<(poVar5,"layout(triangle_strip, max_vertices = ");
  iVar7 = iVar2 * 4;
  if ((this->m_flags & 0x20) == 0) {
    iVar7 = iVar2 + 2;
  }
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
  poVar5 = std::operator<<(poVar5,") out;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,
                           "layout(location = 0) in       mediump ivec2 v_tessellationGridPosition[];\n"
                          );
  poVar5 = std::operator<<(poVar5,"layout(location = 0) flat out highp   vec4  v_color;\n");
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"void main (void)\n");
  poVar5 = std::operator<<(poVar5,"{\n");
  poVar5 = std::operator<<(poVar5,"    const float equalThreshold = 0.001;\n");
  poVar5 = std::operator<<(poVar5,
                           "    const float gapOffset = 0.0001; // subdivision performed by the geometry shader might produce gaps. Fill potential gaps by enlarging the output slice a little.\n"
                          );
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,
                           "    // Input triangle is generated from an axis-aligned rectangle by splitting it in half\n"
                          );
  poVar5 = std::operator<<(poVar5,
                           "    // Original rectangle can be found by finding the bounding AABB of the triangle\n"
                          );
  poVar5 = std::operator<<(poVar5,
                           "    vec4 aabb = vec4(min(gl_in[0].gl_Position.x, min(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
                          );
  poVar5 = std::operator<<(poVar5,
                           "                     min(gl_in[0].gl_Position.y, min(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)),\n"
                          );
  poVar5 = std::operator<<(poVar5,
                           "                     max(gl_in[0].gl_Position.x, max(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
                          );
  poVar5 = std::operator<<(poVar5,
                           "                     max(gl_in[0].gl_Position.y, max(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)));\n"
                          );
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"    // Location in tessellation grid\n");
  poVar5 = std::operator<<(poVar5,
                           "    ivec2 gridPosition = ivec2(min(v_tessellationGridPosition[0], min(v_tessellationGridPosition[1], v_tessellationGridPosition[2])));\n"
                          );
  poVar5 = std::operator<<(poVar5,"\n");
  poVar5 = std::operator<<(poVar5,"    // Which triangle of the two that split the grid cell\n");
  poVar5 = std::operator<<(poVar5,"    int numVerticesOnBottomEdge = 0;\n");
  poVar5 = std::operator<<(poVar5,"    for (int ndx = 0; ndx < 3; ++ndx)\n");
  poVar5 = std::operator<<(poVar5,
                           "        if (abs(gl_in[ndx].gl_Position.y - aabb.w) < equalThreshold)\n")
  ;
  poVar5 = std::operator<<(poVar5,"            ++numVerticesOnBottomEdge;\n");
  poVar5 = std::operator<<(poVar5,"    bool isBottomTriangle = numVerticesOnBottomEdge == 2;\n");
  std::operator<<(poVar5,"\n");
  uVar3 = this->m_flags;
  if ((uVar3 & 0x10) == 0) {
    if ((uVar3 & 0x40) == 0) {
      if ((uVar3 & 8) == 0) {
        poVar5 = std::operator<<((ostream *)&src,"    // Fill the input area with slices\n");
        poVar5 = std::operator<<(poVar5,
                                 "    // Upper triangle produces slices only to the upper half of the quad and vice-versa\n"
                                );
        poVar5 = std::operator<<(poVar5,
                                 "    float triangleOffset = (isBottomTriangle) ? ((aabb.w + aabb.y) / 2.0) : (aabb.y);\n"
                                );
        poVar5 = std::operator<<(poVar5,"    // Each slice is a invocation\n");
        poVar5 = std::operator<<(poVar5,"    float sliceHeight = (aabb.w - aabb.y) / float(2 * ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
        poVar5 = std::operator<<(poVar5,");\n");
        poVar5 = std::operator<<(poVar5,
                                 "    float invocationOffset = float(gl_InvocationID) * sliceHeight;\n"
                                );
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"    vec4 outputSliceArea;\n");
        poVar5 = std::operator<<(poVar5,"    outputSliceArea.x = aabb.x - gapOffset;\n");
        poVar5 = std::operator<<(poVar5,
                                 "    outputSliceArea.y = triangleOffset + invocationOffset - gapOffset;\n"
                                );
        poVar5 = std::operator<<(poVar5,"    outputSliceArea.z = aabb.z + gapOffset;\n");
        pcVar4 = 
        "    outputSliceArea.w = triangleOffset + invocationOffset + sliceHeight + gapOffset;\n";
      }
      else {
        poVar5 = std::operator<<((ostream *)&src,"    // Scatter slices\n");
        poVar5 = std::operator<<(poVar5,
                                 "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
                                );
        poVar5 = std::operator<<(poVar5,
                                 "    ivec2 srcSliceNdx = ivec2(gridPosition.x, gridPosition.y * ");
        iVar1 = iVar1 * 2;
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
        poVar5 = std::operator<<(poVar5," + inputTriangleNdx);\n");
        poVar5 = std::operator<<(poVar5,
                                 "    ivec2 dstSliceNdx = ivec2(7 * srcSliceNdx.x, 127 * srcSliceNdx.y) % ivec2("
                                );
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
        poVar5 = std::operator<<(poVar5,", ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
        poVar5 = std::operator<<(poVar5," * ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
        poVar5 = std::operator<<(poVar5,");\n");
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::operator<<(poVar5,"    // Draw slice to the dstSlice slot\n");
        poVar5 = std::operator<<(poVar5,"    vec4 outputSliceArea;\n");
        poVar5 = std::operator<<(poVar5,"    outputSliceArea.x = float(dstSliceNdx.x)   / float(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
        poVar5 = std::operator<<(poVar5,") * 2.0 - 1.0 - gapOffset;\n");
        poVar5 = std::operator<<(poVar5,"    outputSliceArea.y = float(dstSliceNdx.y)   / float(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel * iVar1);
        poVar5 = std::operator<<(poVar5,") * 2.0 - 1.0 - gapOffset;\n");
        poVar5 = std::operator<<(poVar5,"    outputSliceArea.z = float(dstSliceNdx.x+1) / float(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
        pcVar4 = ") * 2.0 - 1.0 + gapOffset;\n";
        poVar5 = std::operator<<(poVar5,") * 2.0 - 1.0 + gapOffset;\n");
        poVar5 = std::operator<<(poVar5,"    outputSliceArea.w = float(dstSliceNdx.y+1) / float(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1 * this->m_tessGenLevel);
      }
      std::operator<<(poVar5,pcVar4);
      poVar5 = std::operator<<((ostream *)&src,"\n");
      poVar5 = std::operator<<(poVar5,"    // Draw slice\n");
      poVar5 = std::operator<<(poVar5,"    for (int ndx = 0; ndx < ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(iVar2 + 2) / 2);
      poVar5 = std::operator<<(poVar5,"; ++ndx)\n");
      poVar5 = std::operator<<(poVar5,"    {\n");
      poVar5 = std::operator<<(poVar5,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n");
      poVar5 = std::operator<<(poVar5,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n");
      poVar5 = std::operator<<(poVar5,
                               "        vec4 outputColor = (((gl_InvocationID + ndx) % 2) == 0) ? (green) : (yellow);\n"
                              );
      poVar5 = std::operator<<(poVar5,
                               "        float xpos = mix(outputSliceArea.x, outputSliceArea.z, float(ndx) / float("
                              );
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2 / 2);
      poVar5 = std::operator<<(poVar5,"));\n");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,
                               "        gl_Position = vec4(xpos, outputSliceArea.y, 0.0, 1.0);\n");
      poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
      pcVar4 = "        EmitVertex();\n";
      poVar5 = std::operator<<(poVar5,"        EmitVertex();\n");
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,
                               "        gl_Position = vec4(xpos, outputSliceArea.w, 0.0, 1.0);\n");
      poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
      goto LAB_0073c16d;
    }
    poVar5 = std::operator<<((ostream *)&src,
                             "    // Draw grid cells, send each primitive to a separate layer\n");
    poVar5 = std::operator<<(poVar5,
                             "    int baseLayer = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
                            );
    poVar5 = std::operator<<(poVar5,"    for (int ndx = 0; ndx < ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,"; ++ndx)\n");
    poVar5 = std::operator<<(poVar5,"    {\n");
    poVar5 = std::operator<<(poVar5,"        ivec2 dstGridSize = ivec2(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
    poVar5 = std::operator<<(poVar5," * ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
    poVar5 = std::operator<<(poVar5,");\n");
    poVar5 = std::operator<<(poVar5,"        ivec2 dstGridNdx = ivec2((gridPosition.x * ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,
                             " * 7 + ndx)*13, (gridPosition.y * 127 + ndx) * 19) % dstGridSize;\n");
    poVar5 = std::operator<<(poVar5,"        vec4 dstArea;\n");
    poVar5 = std::operator<<(poVar5,
                             "        dstArea.x = float(dstGridNdx.x) / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
                            );
    poVar5 = std::operator<<(poVar5,
                             "        dstArea.y = float(dstGridNdx.y) / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
                            );
    poVar5 = std::operator<<(poVar5,
                             "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
                            );
    poVar5 = std::operator<<(poVar5,
                             "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
                            );
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n");
    poVar5 = std::operator<<(poVar5,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n");
    poVar5 = std::operator<<(poVar5,
                             "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
                            );
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n")
    ;
    poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
    poVar5 = std::operator<<(poVar5,"        gl_Layer = ((baseLayer + ndx) * 11) % ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_numLayers);
    poVar5 = std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<(poVar5,"        EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n")
    ;
    poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
    poVar5 = std::operator<<(poVar5,"        gl_Layer = ((baseLayer + ndx) * 11) % ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_numLayers);
    poVar5 = std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<(poVar5,"        EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n")
    ;
    poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
    poVar5 = std::operator<<(poVar5,"        gl_Layer = ((baseLayer + ndx) * 11) % ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_numLayers);
    pcVar4 = ";\n";
    poVar5 = std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<(poVar5,"        EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n")
    ;
    poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
    poVar5 = std::operator<<(poVar5,"        gl_Layer = ((baseLayer + ndx) * 11) % ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_numLayers);
  }
  else {
    poVar5 = std::operator<<((ostream *)&src,"    // Draw grid cells\n");
    poVar5 = std::operator<<(poVar5,
                             "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
                            );
    poVar5 = std::operator<<(poVar5,"    for (int ndx = 0; ndx < ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,"; ++ndx)\n");
    poVar5 = std::operator<<(poVar5,"    {\n");
    poVar5 = std::operator<<(poVar5,"        ivec2 dstGridSize = ivec2(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
    poVar5 = std::operator<<(poVar5," * ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    poVar5 = std::operator<<(poVar5,", 2 * ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
    poVar5 = std::operator<<(poVar5," * ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    poVar5 = std::operator<<(poVar5,");\n");
    poVar5 = std::operator<<(poVar5,"        ivec2 dstGridNdx = ivec2(");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
    poVar5 = std::operator<<(poVar5," * ndx + gridPosition.x, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_tessGenLevel);
    poVar5 = std::operator<<(poVar5,
                             " * inputTriangleNdx + 2 * gridPosition.y + ndx * 127) % dstGridSize;\n"
                            );
    poVar5 = std::operator<<(poVar5,"        vec4 dstArea;\n");
    poVar5 = std::operator<<(poVar5,
                             "        dstArea.x = float(dstGridNdx.x)   / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
                            );
    poVar5 = std::operator<<(poVar5,
                             "        dstArea.y = float(dstGridNdx.y)   / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
                            );
    poVar5 = std::operator<<(poVar5,
                             "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
                            );
    poVar5 = std::operator<<(poVar5,
                             "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
                            );
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n");
    poVar5 = std::operator<<(poVar5,"        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n");
    poVar5 = std::operator<<(poVar5,
                             "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
                            );
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n")
    ;
    poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
    poVar5 = std::operator<<(poVar5,"        EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n")
    ;
    poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
    poVar5 = std::operator<<(poVar5,"        EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n")
    ;
    pcVar4 = "        v_color = outputColor;\n";
    poVar5 = std::operator<<(poVar5,"        v_color = outputColor;\n");
    poVar5 = std::operator<<(poVar5,"        EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n")
    ;
  }
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::operator<<(poVar5,"        EmitVertex();\n");
  pcVar4 = "        EndPrimitive();\n";
LAB_0073c16d:
  poVar5 = std::operator<<(poVar5,pcVar4);
  std::operator<<(poVar5,"    }\n");
  std::operator<<((ostream *)&src,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"geom",&local_211);
  pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1f0);
  std::__cxx11::stringbuf::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)local_1d0,&local_210);
  glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_1d0);
  std::__cxx11::string::~string((string *)(local_1d0 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  return;
}

Assistant:

void GridRenderTestCase::initPrograms (SourceCollections& programCollection) const
{
	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "layout(location = 0) flat in highp   vec4 v_color;\n"
			<< "layout(location = 0) out     mediump vec4 fragColor;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    fragColor = v_color;\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}

	// Tessellation control
	{
		std::ostringstream src;
		src <<	glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
				"#extension GL_EXT_tessellation_shader : require\n"
				"layout(vertices = 1) out;\n"
				"\n"
				"void main (void)\n"
				"{\n"
				"    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
				"    gl_TessLevelInner[0] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelInner[1] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[0] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[1] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[2] = float(" << m_tessGenLevel << ");\n"
				"    gl_TessLevelOuter[3] = float(" << m_tessGenLevel << ");\n"
				"}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	// Tessellation evaluation
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_tessellation_shader : require\n"
			<< "layout(quads) in;\n"
			<< "\n"
			<< "layout(location = 0) out mediump ivec2 v_tessellationGridPosition;\n"
			<< "\n"
			<< "// note: No need to use precise gl_Position since position does not depend on order\n"
			<< "void main (void)\n"
			<< "{\n";

		if (m_flags & (FLAG_GEOMETRY_SCATTER_INSTANCES | FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SCATTER_LAYERS))
			src << "    // Cover only a small area in a corner. The area will be expanded in geometry shader to cover whole viewport\n"
				<< "    gl_Position = vec4(gl_TessCoord.x * 0.3 - 1.0, gl_TessCoord.y * 0.3 - 1.0, 0.0, 1.0);\n";
		else
			src << "    // Fill the whole viewport\n"
				<< "    gl_Position = vec4(gl_TessCoord.x * 2.0 - 1.0, gl_TessCoord.y * 2.0 - 1.0, 0.0, 1.0);\n";

		src << "    // Calculate position in tessellation grid\n"
			<< "    v_tessellationGridPosition = ivec2(round(gl_TessCoord.xy * float(" << m_tessGenLevel << ")));\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	// Geometry shader
	{
		const int numInvocations = m_numGeometryInvocations;
		const int numPrimitives  = m_numGeometryPrimitivesPerInvocation;

		std::ostringstream src;

		src	<< glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES) << "\n"
			<< "#extension GL_EXT_geometry_shader : require\n"
			<< "layout(triangles, invocations = " << numInvocations << ") in;\n"
			<< "layout(triangle_strip, max_vertices = " << ((m_flags & FLAG_GEOMETRY_SEPARATE_PRIMITIVES) ? (4 * numPrimitives) : (numPrimitives + 2)) << ") out;\n"
			<< "\n"
			<< "layout(location = 0) in       mediump ivec2 v_tessellationGridPosition[];\n"
			<< "layout(location = 0) flat out highp   vec4  v_color;\n"
			<< "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< "    const float equalThreshold = 0.001;\n"
			<< "    const float gapOffset = 0.0001; // subdivision performed by the geometry shader might produce gaps. Fill potential gaps by enlarging the output slice a little.\n"
			<< "\n"
			<< "    // Input triangle is generated from an axis-aligned rectangle by splitting it in half\n"
			<< "    // Original rectangle can be found by finding the bounding AABB of the triangle\n"
			<< "    vec4 aabb = vec4(min(gl_in[0].gl_Position.x, min(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
			<< "                     min(gl_in[0].gl_Position.y, min(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)),\n"
			<< "                     max(gl_in[0].gl_Position.x, max(gl_in[1].gl_Position.x, gl_in[2].gl_Position.x)),\n"
			<< "                     max(gl_in[0].gl_Position.y, max(gl_in[1].gl_Position.y, gl_in[2].gl_Position.y)));\n"
			<< "\n"
			<< "    // Location in tessellation grid\n"
			<< "    ivec2 gridPosition = ivec2(min(v_tessellationGridPosition[0], min(v_tessellationGridPosition[1], v_tessellationGridPosition[2])));\n"
			<< "\n"
			<< "    // Which triangle of the two that split the grid cell\n"
			<< "    int numVerticesOnBottomEdge = 0;\n"
			<< "    for (int ndx = 0; ndx < 3; ++ndx)\n"
			<< "        if (abs(gl_in[ndx].gl_Position.y - aabb.w) < equalThreshold)\n"
			<< "            ++numVerticesOnBottomEdge;\n"
			<< "    bool isBottomTriangle = numVerticesOnBottomEdge == 2;\n"
			<< "\n";

		if (m_flags & FLAG_GEOMETRY_SCATTER_PRIMITIVES)
		{
			// scatter primitives
			src << "    // Draw grid cells\n"
				<< "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
				<< "    for (int ndx = 0; ndx < " << numPrimitives << "; ++ndx)\n"
				<< "    {\n"
				<< "        ivec2 dstGridSize = ivec2(" << m_tessGenLevel << " * " << numPrimitives << ", 2 * " << m_tessGenLevel << " * " << numInvocations << ");\n"
				<< "        ivec2 dstGridNdx = ivec2(" << m_tessGenLevel << " * ndx + gridPosition.x, " << m_tessGenLevel << " * inputTriangleNdx + 2 * gridPosition.y + ndx * 127) % dstGridSize;\n"
				<< "        vec4 dstArea;\n"
				<< "        dstArea.x = float(dstGridNdx.x)   / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.y = float(dstGridNdx.y)   / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
				<< "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
				<< "\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    }\n";
		}
		else if (m_flags & FLAG_GEOMETRY_SCATTER_LAYERS)
		{
			// Number of subrectangle instances = num layers
			DE_ASSERT(m_numLayers == numInvocations * 2);

			src << "    // Draw grid cells, send each primitive to a separate layer\n"
				<< "    int baseLayer = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
				<< "    for (int ndx = 0; ndx < " << numPrimitives << "; ++ndx)\n"
				<< "    {\n"
				<< "        ivec2 dstGridSize = ivec2(" << m_tessGenLevel << " * " << numPrimitives << ", " << m_tessGenLevel << ");\n"
				<< "        ivec2 dstGridNdx = ivec2((gridPosition.x * " << numPrimitives << " * 7 + ndx)*13, (gridPosition.y * 127 + ndx) * 19) % dstGridSize;\n"
				<< "        vec4 dstArea;\n"
				<< "        dstArea.x = float(dstGridNdx.x) / float(dstGridSize.x) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.y = float(dstGridNdx.y) / float(dstGridSize.y) * 2.0 - 1.0 - gapOffset;\n"
				<< "        dstArea.z = float(dstGridNdx.x+1) / float(dstGridSize.x) * 2.0 - 1.0 + gapOffset;\n"
				<< "        dstArea.w = float(dstGridNdx.y+1) / float(dstGridSize.y) * 2.0 - 1.0 + gapOffset;\n"
				<< "\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((dstGridNdx.y + dstGridNdx.x) % 2) == 0) ? (green) : (yellow);\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.x, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(dstArea.z, dstArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        gl_Layer = ((baseLayer + ndx) * 11) % " << m_numLayers << ";\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    }\n";
		}
		else
		{
			if (m_flags & FLAG_GEOMETRY_SCATTER_INSTANCES)
			{
				src << "    // Scatter slices\n"
					<< "    int inputTriangleNdx = gl_InvocationID * 2 + ((isBottomTriangle) ? (1) : (0));\n"
					<< "    ivec2 srcSliceNdx = ivec2(gridPosition.x, gridPosition.y * " << (numInvocations*2) << " + inputTriangleNdx);\n"
					<< "    ivec2 dstSliceNdx = ivec2(7 * srcSliceNdx.x, 127 * srcSliceNdx.y) % ivec2(" << m_tessGenLevel << ", " << m_tessGenLevel << " * " << (numInvocations*2) << ");\n"
					<< "\n"
					<< "    // Draw slice to the dstSlice slot\n"
					<< "    vec4 outputSliceArea;\n"
					<< "    outputSliceArea.x = float(dstSliceNdx.x)   / float(" << m_tessGenLevel << ") * 2.0 - 1.0 - gapOffset;\n"
					<< "    outputSliceArea.y = float(dstSliceNdx.y)   / float(" << (m_tessGenLevel * numInvocations * 2) << ") * 2.0 - 1.0 - gapOffset;\n"
					<< "    outputSliceArea.z = float(dstSliceNdx.x+1) / float(" << m_tessGenLevel << ") * 2.0 - 1.0 + gapOffset;\n"
					<< "    outputSliceArea.w = float(dstSliceNdx.y+1) / float(" << (m_tessGenLevel * numInvocations * 2) << ") * 2.0 - 1.0 + gapOffset;\n";
			}
			else
			{
				src << "    // Fill the input area with slices\n"
					<< "    // Upper triangle produces slices only to the upper half of the quad and vice-versa\n"
					<< "    float triangleOffset = (isBottomTriangle) ? ((aabb.w + aabb.y) / 2.0) : (aabb.y);\n"
					<< "    // Each slice is a invocation\n"
					<< "    float sliceHeight = (aabb.w - aabb.y) / float(2 * " << numInvocations << ");\n"
					<< "    float invocationOffset = float(gl_InvocationID) * sliceHeight;\n"
					<< "\n"
					<< "    vec4 outputSliceArea;\n"
					<< "    outputSliceArea.x = aabb.x - gapOffset;\n"
					<< "    outputSliceArea.y = triangleOffset + invocationOffset - gapOffset;\n"
					<< "    outputSliceArea.z = aabb.z + gapOffset;\n"
					<< "    outputSliceArea.w = triangleOffset + invocationOffset + sliceHeight + gapOffset;\n";
			}

			src << "\n"
				<< "    // Draw slice\n"
				<< "    for (int ndx = 0; ndx < " << ((numPrimitives+2)/2) << "; ++ndx)\n"
				<< "    {\n"
				<< "        vec4 green = vec4(0.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 yellow = vec4(1.0, 1.0, 0.0, 1.0);\n"
				<< "        vec4 outputColor = (((gl_InvocationID + ndx) % 2) == 0) ? (green) : (yellow);\n"
				<< "        float xpos = mix(outputSliceArea.x, outputSliceArea.z, float(ndx) / float(" << (numPrimitives/2) << "));\n"
				<< "\n"
				<< "        gl_Position = vec4(xpos, outputSliceArea.y, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(xpos, outputSliceArea.w, 0.0, 1.0);\n"
				<< "        v_color = outputColor;\n"
				<< "        EmitVertex();\n"
				<< "    }\n";
		}

		src <<	"}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}
}